

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

WeierstrassPoint * wpoint(WeierstrassCurve *wc,size_t index)

{
  mp_int *x;
  mp_int *y;
  WeierstrassPoint *pWVar1;
  char *hex;
  char *pcVar2;
  
  switch(index) {
  case 0:
    x = (mp_int *)0x0;
    y = (mp_int *)0x0;
    goto LAB_00109efb;
  case 1:
    pcVar2 = "3c2c799a365b53d003ef37dab65860bf80ae";
    hex = "12345";
    break;
  case 2:
    pcVar2 = "5bde01693130591400b5c9d257d8325a44a5";
    hex = "4e1c77e3c00f7c3b15869e6a4e5f86b3ee53";
    break;
  case 3:
    pcVar2 = "0x033d636b855c931cfe679f0b18db164a0d64";
    goto LAB_00109ed1;
  case 4:
    pcVar2 = "0xbe55d3f4b86bc38ff4b6622c418e599546ed";
LAB_00109ed1:
    pcVar2 = pcVar2 + 2;
    hex = "b5f0e722b2f0f7e729f55ba9f15511e3b399";
    break;
  default:
    __assert_fail("false && \"only 5 example Weierstrass points defined\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                  0x32a,"WeierstrassPoint *wpoint(WeierstrassCurve *, size_t)");
  }
  x = mp_from_hex(hex);
  y = mp_from_hex(pcVar2);
LAB_00109efb:
  if (y == (mp_int *)0x0 || x == (mp_int *)0x0) {
    pWVar1 = ecc_weierstrass_point_new_identity(wc);
  }
  else {
    pWVar1 = ecc_weierstrass_point_new(wc,x,y);
  }
  if (x != (mp_int *)0x0) {
    mp_free(x);
  }
  if (y != (mp_int *)0x0) {
    mp_free(y);
  }
  return pWVar1;
}

Assistant:

static WeierstrassPoint *wpoint(WeierstrassCurve *wc, size_t index)
{
    mp_int *x = NULL, *y = NULL;
    WeierstrassPoint *wp;
    switch (index) {
      case 0:
        break;
      case 1:
        x = MP_LITERAL(0x12345);
        y = MP_LITERAL(0x3c2c799a365b53d003ef37dab65860bf80ae);
        break;
      case 2:
        x = MP_LITERAL(0x4e1c77e3c00f7c3b15869e6a4e5f86b3ee53);
        y = MP_LITERAL(0x5bde01693130591400b5c9d257d8325a44a5);
        break;
      case 3:
        x = MP_LITERAL(0xb5f0e722b2f0f7e729f55ba9f15511e3b399);
        y = MP_LITERAL(0x033d636b855c931cfe679f0b18db164a0d64);
        break;
      case 4:
        x = MP_LITERAL(0xb5f0e722b2f0f7e729f55ba9f15511e3b399);
        y = MP_LITERAL(0xbe55d3f4b86bc38ff4b6622c418e599546ed);
        break;
      default:
        unreachable("only 5 example Weierstrass points defined");
    }
    if (x && y) {
        wp = ecc_weierstrass_point_new(wc, x, y);
    } else {
        wp = ecc_weierstrass_point_new_identity(wc);
    }
    if (x)
        mp_free(x);
    if (y)
        mp_free(y);
    return wp;
}